

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O1

VRMatrix4 *
MinVR::VRMatrix4::projection
          (VRMatrix4 *__return_storage_ptr__,float left,float right,float bottom,float top,
          float near,float far)

{
  float in_XMM0_Db;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float local_48 [6];
  undefined8 local_30;
  undefined8 uStack_28;
  float local_20;
  undefined8 local_1c;
  undefined4 local_14;
  float local_10;
  undefined4 local_c;
  
  local_48[0] = (near + near) / (right - left);
  auVar1._0_4_ = left + right;
  auVar1._4_4_ = bottom + top;
  auVar1._8_4_ = in_XMM0_Db + in_XMM1_Db;
  auVar1._12_4_ = in_XMM2_Db + in_XMM3_Db;
  auVar2._4_4_ = top - bottom;
  auVar2._0_4_ = right - left;
  auVar2._8_4_ = in_XMM1_Db - in_XMM0_Db;
  auVar2._12_4_ = in_XMM3_Db - in_XMM2_Db;
  auVar2 = divps(auVar1,auVar2);
  local_48[5] = (near + near) / (top - bottom);
  local_20 = -(near + far) / (far - near);
  local_10 = (far * -2.0 * near) / (far - near);
  local_14 = 0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_48[4] = 0.0;
  uStack_28 = auVar2._0_8_;
  local_30 = 0;
  local_1c = 0xbf800000;
  local_c = 0;
  VRMatrix4(__return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::projection(float left, float right,
                                float bottom, float top,
		                        float near, float far)
{
  return VRMatrix4::fromRowMajorElements(2.0f*near/(right-left), 0, (right+left)/(right-left), 0,
                                         0, 2.0f*near/(top-bottom), (top+bottom)/(top-bottom), 0,
                                         0, 0, -(far+near)/(far-near), -2.0f*far*near/(far-near),
                                         0, 0, -1, 0);
}